

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaTreeItemPtr_conflict
xmlSchemaParseModelGroupDefRef(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  _xmlAttr *p_Var1;
  int iVar2;
  uint min;
  int max;
  xmlNodePtr pxVar3;
  xmlAttrPtr pxVar4;
  xmlSchemaParticlePtr pxVar5;
  xmlSchemaQNameRefPtr pxVar6;
  xmlSchemaAnnotPtr pxVar7;
  xmlNodePtr in_RCX;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr pxVar8;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlSchemaBasicItemPtr extraout_RDX_05;
  char *in_R8;
  xmlAttrPtr *value;
  char *pcVar9;
  char *in_R9;
  xmlChar **uri;
  xmlChar *refNs;
  xmlChar *ref;
  xmlChar **in_stack_ffffffffffffffa8;
  xmlAttrPtr local_48;
  xmlChar *local_40;
  xmlAttrPtr local_38;
  
  local_40 = (xmlChar *)0x0;
  local_48 = (xmlAttrPtr)0x0;
  if (node == (xmlNodePtr)0x0) {
    return (xmlSchemaTreeItemPtr_conflict)0x0;
  }
  pxVar3 = (xmlNodePtr)xmlSchemaGetPropNode(node,"ref");
  if (pxVar3 == (xmlNodePtr)0x0) {
    xmlSchemaPMissingAttrErr
              (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1fc6ab,in_RCX,in_R8,in_R9);
  }
  else {
    pxVar4 = (xmlAttrPtr)xmlSchemaGetNodeContent(ctxt,pxVar3);
    value = &local_48;
    uri = &local_40;
    iVar2 = xmlSchemaPValAttrNodeQNameValue
                      (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar3,pxVar4,(xmlChar *)value,uri,
                       in_stack_ffffffffffffffa8);
    if (iVar2 == 0) {
      local_38 = local_48;
      xmlSchemaCheckReference(ctxt,(xmlSchemaPtr)node,pxVar3,local_48,(xmlChar *)value);
      min = xmlGetMinOccurs(ctxt,node,-1,0x203502,(int)value,(char *)uri);
      pcVar9 = "(xs:nonNegativeInteger | unbounded)";
      pxVar4 = (xmlAttrPtr)&DAT_40000000;
      max = xmlGetMaxOccurs(ctxt,node,0,0x40000000,0x203518,(char *)uri);
      iVar2 = (int)pcVar9;
      pxVar8 = extraout_RDX;
      for (p_Var1 = node->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
        if (p_Var1->ns == (xmlNs *)0x0) {
          iVar2 = xmlStrEqual(p_Var1->name,"ref");
          pxVar8 = extraout_RDX_02;
          if ((((iVar2 == 0) &&
               (iVar2 = xmlStrEqual(p_Var1->name,"id"), pxVar8 = extraout_RDX_03, iVar2 == 0)) &&
              (iVar2 = xmlStrEqual(p_Var1->name,(xmlChar *)"minOccurs"), pxVar8 = extraout_RDX_04,
              iVar2 == 0)) &&
             (iVar2 = xmlStrEqual(p_Var1->name,(xmlChar *)"maxOccurs"), pxVar8 = extraout_RDX_05,
             iVar2 == 0)) goto LAB_001bd2d4;
        }
        else {
          iVar2 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar8 = extraout_RDX_00;
          if (iVar2 != 0) {
LAB_001bd2d4:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,pxVar8,pxVar4);
            pxVar8 = extraout_RDX_01;
          }
        }
        iVar2 = (int)pcVar9;
      }
      xmlSchemaPValAttrID(ctxt,node,(xmlChar *)pxVar8);
      pxVar5 = xmlSchemaAddParticle(ctxt,node,min,max);
      if (pxVar5 != (xmlSchemaParticlePtr)0x0) {
        pxVar6 = xmlSchemaNewQNameRef(ctxt,XML_SCHEMA_TYPE_GROUP,local_40,(xmlChar *)local_38);
        pxVar5->children = (xmlSchemaTreeItemPtr_conflict)pxVar6;
        xmlSchemaPCheckParticleCorrect_2
                  (ctxt,(xmlSchemaParticlePtr)node,(xmlNodePtr)(ulong)min,max,iVar2);
        pxVar3 = node->children;
        if (pxVar3 != (xmlNodePtr)0x0) {
          if (((pxVar3->ns != (xmlNs *)0x0) &&
              (iVar2 = xmlStrEqual(pxVar3->name,"annotation"), iVar2 != 0)) &&
             (iVar2 = xmlStrEqual(pxVar3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar2 != 0)) {
            pxVar7 = xmlSchemaParseAnnotation(ctxt,pxVar3,1);
            pxVar5->annot = pxVar7;
            pxVar3 = pxVar3->next;
            if (pxVar3 == (_xmlNode *)0x0) goto LAB_001bd403;
          }
          xmlSchemaPContentErr
                    (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,pxVar3,
                     (xmlNodePtr)0x0,"(annotation?)",(char *)in_stack_ffffffffffffffa8);
        }
LAB_001bd403:
        if (min != 0 || max != 0) {
          return (xmlSchemaTreeItemPtr_conflict)pxVar5;
        }
        return (xmlSchemaTreeItemPtr_conflict)0x0;
      }
    }
  }
  return (xmlSchemaTreeItemPtr_conflict)0x0;
}

Assistant:

static xmlSchemaTreeItemPtr
xmlSchemaParseModelGroupDefRef(xmlSchemaParserCtxtPtr ctxt,
			       xmlSchemaPtr schema,
			       xmlNodePtr node)
{
    xmlSchemaParticlePtr item;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    const xmlChar *ref = NULL, *refNs = NULL;
    int min, max;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    attr = xmlSchemaGetPropNode(node, "ref");
    if (attr == NULL) {
	xmlSchemaPMissingAttrErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node, "ref", NULL);
	return (NULL);
    } else if (xmlSchemaPValAttrNodeQName(ctxt, schema, NULL,
	attr, &refNs, &ref) != 0) {
	return (NULL);
    }
    xmlSchemaCheckReference(ctxt, schema, node, attr, refNs);
    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1,
	"(xs:nonNegativeInteger | unbounded)");
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "ref")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "minOccurs")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "maxOccurs"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    item = xmlSchemaAddParticle(ctxt, node, min, max);
    if (item == NULL)
	return (NULL);
    /*
    * Create a qname-reference and set as the term; it will be substituted
    * for the model group after the reference has been resolved.
    */
    item->children = (xmlSchemaTreeItemPtr)
	xmlSchemaNewQNameRef(ctxt, XML_SCHEMA_TYPE_GROUP, ref, refNs);
    xmlSchemaPCheckParticleCorrect_2(ctxt, item, node, min, max);
    /*
    * And now for the children...
    */
    child = node->children;
    /* TODO: Is annotation even allowed for a model group reference? */
    if (IS_SCHEMA(child, "annotation")) {
	/*
	* TODO: What to do exactly with the annotation?
	*/
	item->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?)");
    }
    /*
    * Corresponds to no component at all if minOccurs==maxOccurs==0.
    */
    if ((min == 0) && (max == 0))
	return (NULL);

    return ((xmlSchemaTreeItemPtr) item);
}